

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall cmMakefile::GetSafeDefinition(cmMakefile *this,string *name)

{
  int iVar1;
  string *psVar2;
  
  if (GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    if (iVar1 != 0) {
      GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_.field_2;
      GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_._M_string_length = 0;
      GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    }
  }
  psVar2 = GetDef(this,name);
  if (psVar2 == (string *)0x0) {
    psVar2 = &GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& cmMakefile::GetSafeDefinition(const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    return empty;
  }
  return *def;
}